

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

buffer_appender<char>
fmt::v7::detail::write_char<char,fmt::v7::detail::buffer_appender<char>>
          (buffer_appender<char> out,char value,basic_format_specs<char> *specs)

{
  buffer_appender<char> bVar1;
  long lVar2;
  ulong uVar3;
  buffer<char> *buf;
  ulong uVar4;
  ulong n;
  
  uVar4 = 0;
  if ((ulong)(uint)specs->width != 0) {
    uVar4 = (ulong)(uint)specs->width - 1;
  }
  n = uVar4 >> (*(byte *)((long)&basic_data<void>::left_padding_shifts +
                         (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
  if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x18) <
      *(long *)((long)out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
               0x10) + (specs->fill).size_ * uVar4 + 1) {
    (*(code *)**(undefined8 **)
                out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
  }
  bVar1 = fill<fmt::v7::detail::buffer_appender<char>,char>(out,n,&specs->fill);
  lVar2 = *(long *)((long)bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container
                   + 0x10);
  uVar3 = lVar2 + 1;
  if (*(ulong *)((long)bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container +
                0x18) < uVar3) {
    (*(code *)**(undefined8 **)
                bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container)
              (bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container);
    lVar2 = *(long *)((long)bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                            container + 0x10);
    uVar3 = lVar2 + 1;
  }
  *(ulong *)((long)bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container + 0x10
            ) = uVar3;
  *(char *)(*(long *)((long)bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                            container + 8) + lVar2) = value;
  bVar1 = fill<fmt::v7::detail::buffer_appender<char>,char>(bVar1,uVar4 - n,&specs->fill);
  return (buffer_appender<char>)
         bVar1.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

OutputIt write_char(OutputIt out, Char value,
                    const basic_format_specs<Char>& specs) {
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, 1, [=](iterator it) {
    *it++ = value;
    return it;
  });
}